

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest::BuildFileInTestPool
          (ValidationErrorTest *this,FileDescriptor *file)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  char *message;
  char *in_R9;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_;
  undefined1 local_110 [8];
  FileDescriptorProto file_proto;
  FileDescriptor *file_local;
  ValidationErrorTest *this_local;
  
  file_proto.field_0._224_8_ = file;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110);
  FileDescriptor::CopyTo
            ((FileDescriptor *)file_proto.field_0._224_8_,(FileDescriptorProto *)local_110);
  pFVar2 = DescriptorPool::BuildFile(&this->pool_,(FileDescriptorProto *)local_110);
  local_131 = pFVar2 != (FileDescriptor *)0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_130,
               (AssertionResult *)"pool_.BuildFile(file_proto) != nullptr","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x121f,message);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
  return;
}

Assistant:

void BuildFileInTestPool(const FileDescriptor* file) {
    FileDescriptorProto file_proto;
    file->CopyTo(&file_proto);
    ASSERT_TRUE(pool_.BuildFile(file_proto) != nullptr);
  }